

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_rawdeleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  bool bVar1;
  SQInteger SVar2;
  SQObjectPtr *this;
  undefined1 local_48 [8];
  SQObjectPtr t;
  SQObjectPtr *key;
  SQObjectPtr *self;
  SQBool pushval_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  self = (SQObjectPtr *)pushval;
  pushval_local = idx;
  idx_local = (SQInteger)v;
  SVar2 = sq_gettop(v);
  if (SVar2 < 2) {
    SQVM::Raise_Error((SQVM *)idx_local,"not enough params in the stack");
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    bVar1 = sq_aux_gettypedarg((HSQUIRRELVM)idx_local,pushval_local,OT_TABLE,&key);
    if (bVar1) {
      t.super_SQObject._unVal.nInteger = (SQInteger)SQVM::GetUp(idx_local,-1);
      SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_48);
      bVar1 = SQTable::Get((key->super_SQObject)._unVal.pTable,
                           (SQObjectPtr *)t.super_SQObject._unVal.pTable,(SQObjectPtr *)local_48);
      if (bVar1) {
        SQTable::Remove((key->super_SQObject)._unVal.pTable,
                        (SQObjectPtr *)t.super_SQObject._unVal.pTable);
      }
      if (self == (SQObjectPtr *)0x0) {
        SQVM::Pop((SQVM *)idx_local);
      }
      else {
        this = SQVM::GetUp((SQVM *)idx_local,-1);
        SQObjectPtr::operator=(this,(SQObjectPtr *)local_48);
      }
      v_local = (HSQUIRRELVM)0x0;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_48);
    }
    else {
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_rawdeleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 2);
    SQObjectPtr *self;
    _GETSAFE_OBJ(v, idx, OT_TABLE,self);
    SQObjectPtr &key = v->GetUp(-1);
    SQObjectPtr t;
    if(_table(*self)->Get(key,t)) {
        _table(*self)->Remove(key);
    }
    if(pushval != 0)
        v->GetUp(-1) = t;
    else
        v->Pop();
    return SQ_OK;
}